

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINAnalyzerSettings.cpp
# Opt level: O0

void __thiscall LINAnalyzerSettings::UpdateInterfacesFromSettings(LINAnalyzerSettings *this)

{
  element_type *peVar1;
  element_type *peVar2;
  LINAnalyzerSettings *this_local;
  
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mInputChannelInterface)
  ;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar1);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mLINVersionInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber(this->mLINVersion);
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceInteger>::operator->(&this->mBitRateInterface);
  AnalyzerSettingInterfaceInteger::SetInteger((int)peVar2);
  return;
}

Assistant:

void LINAnalyzerSettings::UpdateInterfacesFromSettings()
{
    mInputChannelInterface->SetChannel( mInputChannel );
    mLINVersionInterface->SetNumber( mLINVersion );
    mBitRateInterface->SetInteger( mBitRate );
}